

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall rengine::SignalEmitter::~SignalEmitter(SignalEmitter *this)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *this_00;
  SignalEmitter *this_local;
  
  this->_vptr_SignalEmitter = (_func_int **)&PTR__SignalEmitter_0014dba0;
  Signal<>::emit(&onDestruction,this);
  this_00 = this->m_buckets;
  if (this_00 !=
      (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
       *)0x0) {
    std::
    vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
    ::~vector(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

SignalEmitter::~SignalEmitter()
{
    onDestruction.emit(this);
    delete m_buckets;
}